

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaLoader::AddTexture
          (ColladaLoader *this,aiMaterial *mat,ColladaParser *pParser,Effect *effect,
          Sampler *sampler,aiTextureType type,uint idx)

{
  char cVar1;
  size_type sVar2;
  Logger *this_00;
  char *in;
  uint local_438;
  aiString name;
  
  FindFilenameForEffectTexture(&name,this,pParser,effect,&sampler->mName);
  aiMaterial::AddProperty(mat,&name,"$tex.file",type,idx);
  local_438 = sampler->mWrapU ^ 1;
  if ((sampler->mWrapU == 1) && (sampler->mMirrorU == true)) {
    local_438 = 2;
  }
  aiMaterial::AddProperty(mat,(int *)&local_438,1,"$tex.mapmodeu",type,idx);
  local_438 = sampler->mWrapV ^ 1;
  if ((sampler->mWrapV == 1) && (sampler->mMirrorV == true)) {
    local_438 = 2;
  }
  aiMaterial::AddProperty(mat,(int *)&local_438,1,"$tex.mapmodev",type,idx);
  aiMaterial::AddProperty(mat,&sampler->mTransform,1,"$tex.uvtrafo",type,idx);
  aiMaterial::AddProperty(mat,(int *)&sampler->mOp,1,"$tex.blend",type,idx);
  aiMaterial::AddProperty(mat,&sampler->mWeighting,1,"$tex.blend",type,idx);
  local_438 = sampler->mUVId;
  if (local_438 == 0xffffffff) {
    local_438 = 0xffffffff;
    in = (sampler->mUVChannel)._M_dataplus._M_p;
    for (sVar2 = (sampler->mUVChannel)._M_string_length; sVar2 != 0; sVar2 = sVar2 - 1) {
      cVar1 = *in;
      if ((((byte)(cVar1 - 0x30U) < 10) || (cVar1 == '+')) || (cVar1 == '-')) {
        local_438 = strtoul10(in,(char **)0x0);
        if (local_438 != 0xffffffff) goto LAB_003e4a54;
        break;
      }
      in = in + 1;
    }
    this_00 = DefaultLogger::get();
    Logger::warn(this_00,"Collada: unable to determine UV channel for texture");
    local_438 = 0;
  }
LAB_003e4a54:
  aiMaterial::AddProperty(mat,(int *)&local_438,1,"$tex.uvwsrc",type,idx);
  return;
}

Assistant:

void ColladaLoader::AddTexture(aiMaterial& mat, const ColladaParser& pParser,
    const Collada::Effect& effect,
    const Collada::Sampler& sampler,
    aiTextureType type, unsigned int idx)
{
    // first of all, basic file name
    const aiString name = FindFilenameForEffectTexture(pParser, effect, sampler.mName);
    mat.AddProperty(&name, _AI_MATKEY_TEXTURE_BASE, type, idx);

    // mapping mode
    int map = aiTextureMapMode_Clamp;
    if (sampler.mWrapU)
        map = aiTextureMapMode_Wrap;
    if (sampler.mWrapU && sampler.mMirrorU)
        map = aiTextureMapMode_Mirror;

    mat.AddProperty(&map, 1, _AI_MATKEY_MAPPINGMODE_U_BASE, type, idx);

    map = aiTextureMapMode_Clamp;
    if (sampler.mWrapV)
        map = aiTextureMapMode_Wrap;
    if (sampler.mWrapV && sampler.mMirrorV)
        map = aiTextureMapMode_Mirror;

    mat.AddProperty(&map, 1, _AI_MATKEY_MAPPINGMODE_V_BASE, type, idx);

    // UV transformation
    mat.AddProperty(&sampler.mTransform, 1,
        _AI_MATKEY_UVTRANSFORM_BASE, type, idx);

    // Blend mode
    mat.AddProperty((int*)&sampler.mOp, 1,
        _AI_MATKEY_TEXBLEND_BASE, type, idx);

    // Blend factor
    mat.AddProperty((ai_real*)&sampler.mWeighting, 1,
        _AI_MATKEY_TEXBLEND_BASE, type, idx);

    // UV source index ... if we didn't resolve the mapping, it is actually just
    // a guess but it works in most cases. We search for the frst occurrence of a
    // number in the channel name. We assume it is the zero-based index into the
    // UV channel array of all corresponding meshes. It could also be one-based
    // for some exporters, but we won't care of it unless someone complains about.
    if (sampler.mUVId != UINT_MAX)
        map = sampler.mUVId;
    else {
        map = -1;
        for (std::string::const_iterator it = sampler.mUVChannel.begin(); it != sampler.mUVChannel.end(); ++it) {
            if (IsNumeric(*it)) {
                map = strtoul10(&(*it));
                break;
            }
        }
        if (-1 == map) {
            ASSIMP_LOG_WARN("Collada: unable to determine UV channel for texture");
            map = 0;
        }
    }
    mat.AddProperty(&map, 1, _AI_MATKEY_UVWSRC_BASE, type, idx);
}